

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# am_map.cpp
# Opt level: O1

void DrawMarker(FTexture *tex,double x,double y,int yadjust,INTBOOL flip,double xscale,double yscale
               ,int translation,double alpha,DWORD fillcolor,FRenderStyle renderstyle)

{
  int iVar1;
  DFrameBuffer *this;
  int iVar2;
  FRemapTable *pFVar3;
  ulong uVar4;
  undefined4 in_register_00000014;
  undefined4 in_register_00000084;
  undefined4 in_register_0000008c;
  uint uVar5;
  uint uVar6;
  double y_local;
  double x_local;
  double local_68;
  double local_60;
  double local_58;
  double local_50;
  undefined8 local_48;
  undefined8 local_40;
  undefined8 local_38;
  
  local_48 = CONCAT44(in_register_0000008c,renderstyle.AsDWORD);
  local_40 = CONCAT44(in_register_00000084,fillcolor);
  local_38 = CONCAT44(in_register_00000014,flip);
  if ((tex != (FTexture *)0x0) && (tex->UseType != '\r')) {
    y_local = y;
    x_local = x;
    local_50 = alpha;
    if ((am_rotate.Value == 1) || ((am_rotate.Value == 2 && (viewactive)))) {
      AM_rotatePoint(&x_local,&y_local);
    }
    this = screen;
    iVar1 = f_y;
    uVar4 = (ulong)(uint)f_x;
    iVar2 = (int)((x_local - m_x) * scale_mtof) + f_x;
    local_58 = (double)(yadjust + f_y + (int)((double)f_h - (y_local - m_y) * scale_mtof));
    local_60 = (double)CleanXfac * ((double)tex->Width / (tex->Scale).X) * xscale;
    local_68 = (double)CleanYfac * ((double)tex->Height / (tex->Scale).Y) * yscale;
    uVar5 = f_h + f_y;
    uVar6 = f_w + f_x;
    pFVar3 = TranslationToTable(translation);
    DCanvas::DrawTexture
              ((DCanvas *)this,tex,(double)iVar2,local_58,0x400013af,local_60,local_68,local_50,
               0x400013b0,0x400013a1,(ulong)(uint)iVar1,0x400013a2,(ulong)uVar5,0x400013a3,uVar4,
               0x400013a4,(ulong)uVar6,0x40001395,local_38,0x4000138e,pFVar3,0x4000138c,0x4000138d,
               local_40,0x400013a9,local_48,0);
  }
  return;
}

Assistant:

static void DrawMarker (FTexture *tex, double x, double y, int yadjust,
	INTBOOL flip, double xscale, double yscale, int translation, double alpha, DWORD fillcolor, FRenderStyle renderstyle)
{
	if (tex == NULL || tex->UseType == FTexture::TEX_Null)
	{
		return;
	}
	if (am_rotate == 1 || (am_rotate == 2 && viewactive))
	{
		AM_rotatePoint (&x, &y);
	}
	screen->DrawTexture (tex, CXMTOF(x) + f_x, CYMTOF(y) + yadjust + f_y,
		DTA_DestWidthF, tex->GetScaledWidthDouble() * CleanXfac * xscale,
		DTA_DestHeightF, tex->GetScaledHeightDouble() * CleanYfac * yscale,
		DTA_ClipTop, f_y,
		DTA_ClipBottom, f_y + f_h,
		DTA_ClipLeft, f_x,
		DTA_ClipRight, f_x + f_w,
		DTA_FlipX, flip,
		DTA_Translation, TranslationToTable(translation),
		DTA_AlphaF, alpha,
		DTA_FillColor, fillcolor,
		DTA_RenderStyle, DWORD(renderstyle),
		TAG_DONE);
}